

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void ecs_set_system_status_action
               (ecs_world_t *world,ecs_entity_t system,ecs_system_status_action_t action,void *ctx)

{
  _Bool _Var1;
  int32_t iVar2;
  EcsSystem *system_data_00;
  EcsSystem *system_data;
  void *ctx_local;
  ecs_system_status_action_t action_local;
  ecs_entity_t system_local;
  ecs_world_t *world_local;
  
  system_data_00 = (EcsSystem *)ecs_get_mut_w_entity(world,system,5,(_Bool *)0x0);
  _ecs_assert(system_data_00 != (EcsSystem *)0x0,2,(char *)0x0,"system_data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x150);
  if (system_data_00 == (EcsSystem *)0x0) {
    __assert_fail("system_data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x150,
                  "void ecs_set_system_status_action(ecs_world_t *, ecs_entity_t, ecs_system_status_action_t, const void *)"
                 );
  }
  system_data_00->status_action = action;
  system_data_00->status_ctx = ctx;
  _Var1 = ecs_has_entity(world,system,0x103);
  if (!_Var1) {
    invoke_status_action(world,system,system_data_00,EcsSystemEnabled);
    iVar2 = ecs_vector_count(system_data_00->query->tables);
    if (iVar2 != 0) {
      invoke_status_action(world,system,system_data_00,EcsSystemActivated);
    }
  }
  return;
}

Assistant:

void ecs_set_system_status_action(
    ecs_world_t *world,
    ecs_entity_t system,
    ecs_system_status_action_t action,
    const void *ctx)
{
    EcsSystem *system_data = ecs_get_mut(world, system, EcsSystem, NULL);
    ecs_assert(system_data != NULL, ECS_INVALID_PARAMETER, NULL);

    system_data->status_action = action;
    system_data->status_ctx = (void*)ctx;

    if (!ecs_has_entity(world, system, EcsDisabled)) {
        /* If system is already enabled, generate enable status. The API 
         * should guarantee that it exactly matches enable-disable 
         * notifications and activate-deactivate notifications. */
        invoke_status_action(world, system, system_data, EcsSystemEnabled);

        /* If column system has active (non-empty) tables, also generate the
         * activate status. */
        if (ecs_vector_count(system_data->query->tables)) {
            invoke_status_action(
                world, system, system_data, EcsSystemActivated);
        }
    }
}